

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

Value * __thiscall
minja::MethodCallExpr::do_evaluate
          (Value *__return_storage_ptr__,MethodCallExpr *this,shared_ptr<minja::Context> *context)

{
  _Atomic_word *p_Var1;
  int *piVar2;
  Expression *this_00;
  element_type *peVar3;
  pointer pcVar4;
  object_t *poVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  char cVar9;
  undefined1 uVar10;
  int iVar11;
  int iVar12;
  size_t index;
  size_t sVar13;
  Value *pVVar14;
  Value *pVVar15;
  runtime_error *prVar16;
  long *plVar17;
  size_type *psVar18;
  element_type *peVar19;
  string *psVar20;
  long lVar21;
  data *this_01;
  initializer_list<minja::Value> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sep;
  Value callable;
  ArgumentsValue vargs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  Value obj;
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  element_type *local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  element_type *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1f0;
  data local_1e8;
  Value local_1d8;
  ArgumentsValue local_188;
  undefined1 local_158 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  data local_118;
  undefined1 local_108 [32];
  Value *local_e8;
  Value local_e0;
  Value *local_90;
  vector<minja::Value,_std::allocator<minja::Value>_> local_88;
  vector<minja::Value,_std::allocator<minja::Value>_> local_68;
  vector<minja::Value,_std::allocator<minja::Value>_> local_48;
  
  this_00 = (this->object).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (Expression *)0x0) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar16,"MethodCallExpr.object is null");
LAB_001eb10f:
    __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar16,"MethodCallExpr.method is null");
    goto LAB_001eb10f;
  }
  Expression::evaluate(&local_e0,this_00,context);
  ArgumentsExpression::evaluate(&local_188,&this->args,context);
  if ((((local_e0.object_.
         super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr == (element_type *)0x0) &&
       (local_e0.array_.
        super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0)) && (local_e0.primitive_.m_data.m_type == null)) &&
     (local_e0.callable_.
      super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0)) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_248._0_8_ = local_248 + 0x10;
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_248,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   "Trying to call method \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
    plVar17 = (long *)std::__cxx11::string::append(local_158);
    local_228._0_8_ = *plVar17;
    psVar18 = (size_type *)(plVar17 + 2);
    if ((size_type *)local_228._0_8_ == psVar18) {
      local_228._16_8_ = *psVar18;
      local_228._24_8_ = plVar17[3];
      local_228._0_8_ = local_228 + 0x10;
    }
    else {
      local_228._16_8_ = *psVar18;
    }
    local_228._8_8_ = plVar17[1];
    *plVar17 = (long)psVar18;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::runtime_error::runtime_error(prVar16,(string *)local_228);
    __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_e0.array_.
      super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pVVar14 = (Value *)(local_228 + 0x10);
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    local_228._0_8_ = pVVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_228,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    iVar11 = std::__cxx11::string::compare(local_228);
    if ((Value *)local_228._0_8_ != pVVar14) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if (iVar11 == 0) {
      local_228._0_8_ = pVVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"append method","");
      local_158._0_8_ = (element_type *)0x1;
      local_158._8_8_ = (string *)0x1;
      local_248._0_8_ = (Value *)0x0;
      local_248._8_8_ = (Value *)0x0;
      ArgumentsValue::expectArgs
                (&local_188,(string *)local_228,(pair<unsigned_long,_unsigned_long> *)local_158,
                 (pair<unsigned_long,_unsigned_long> *)local_248);
      if ((Value *)local_228._0_8_ != pVVar14) {
        operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
      }
      Value::push_back(&local_e0,
                       local_188.args.
                       super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
                       super__Vector_impl_data._M_start);
    }
    else {
      peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pcVar4 = (peVar3->name)._M_dataplus._M_p;
      local_228._0_8_ = pVVar14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_228,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
      iVar11 = std::__cxx11::string::compare(local_228);
      if ((Value *)local_228._0_8_ != pVVar14) {
        operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
      }
      if (iVar11 == 0) {
        local_228._0_8_ = pVVar14;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"pop method","");
        local_158._0_8_ = (element_type *)0x0;
        local_158._8_8_ = (string *)0x1;
        local_248._0_8_ = (Value *)0x0;
        local_248._8_8_ = (Value *)0x0;
        ArgumentsValue::expectArgs
                  (&local_188,(string *)local_228,(pair<unsigned_long,_unsigned_long> *)local_158,
                   (pair<unsigned_long,_unsigned_long> *)local_248);
        if ((Value *)local_228._0_8_ != pVVar14) {
          operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
        }
        if (local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_1e8.m_value.object = (object_t *)0x0;
          local_228._0_8_ = (Value *)0x0;
          local_228._8_8_ = (string *)0x0;
          local_228._16_8_ = 0;
          local_228._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_208 = (element_type *)0x0;
          _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1f8 = (element_type *)0x0;
          _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1e8.m_type = null;
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_1e8,true);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_1e8,true);
        }
        else {
          Value::Value((Value *)local_228,
                       local_188.args.
                       super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
                       super__Vector_impl_data._M_start);
        }
        Value::pop(__return_storage_ptr__,&local_e0,(Value *)local_228);
        goto LAB_001eae5b;
      }
      peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pcVar4 = (peVar3->name)._M_dataplus._M_p;
      local_228._0_8_ = pVVar14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_228,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
      iVar11 = std::__cxx11::string::compare(local_228);
      if ((Value *)local_228._0_8_ != pVVar14) {
        operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
      }
      if (iVar11 != 0) goto LAB_001eb2d0;
      local_228._0_8_ = pVVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"insert method","");
      local_158._0_8_ = (element_type *)0x2;
      local_158._8_8_ = (string *)0x2;
      local_248._0_8_ = (Value *)0x0;
      local_248._8_8_ = (Value *)0x0;
      ArgumentsValue::expectArgs
                (&local_188,(string *)local_228,(pair<unsigned_long,_unsigned_long> *)local_158,
                 (pair<unsigned_long,_unsigned_long> *)local_248);
      if ((Value *)local_228._0_8_ != pVVar14) {
        operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
      }
      index = Value::get<long>(local_188.args.
                               super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      if (((long)index < 0) || (sVar13 = Value::size(&local_e0), (long)sVar13 < (long)index)) {
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar16,"Index out of range for insert method");
        __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      Value::insert(&local_e0,index,
                    local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1);
    }
    (__return_storage_ptr__->primitive_).m_data.m_value.object = (object_t *)0x0;
    (__return_storage_ptr__->super_enable_shared_from_this<minja::Value>)._M_weak_this.
    super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->super_enable_shared_from_this<minja::Value>)._M_weak_this.
    super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->array_).
    super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->array_).
    super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->object_).
    super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->object_).
    super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->callable_).
    super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->callable_).
    super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->primitive_).m_data.m_type = null;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant(&__return_storage_ptr__->primitive_,true);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant(&__return_storage_ptr__->primitive_,true);
    goto LAB_001ea1a2;
  }
  local_e8 = __return_storage_ptr__;
  if (local_e0.object_.
      super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pVVar14 = (Value *)(local_228 + 0x10);
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    local_228._0_8_ = pVVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_228,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    iVar11 = std::__cxx11::string::compare(local_228);
    if ((Value *)local_228._0_8_ != pVVar14) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if (iVar11 == 0) {
      local_228._0_8_ = pVVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"items method","");
      local_158._0_8_ = (element_type *)0x0;
      local_158._8_8_ = (string *)0x0;
      local_248._0_8_ = (Value *)0x0;
      local_248._8_8_ = (Value *)0x0;
      ArgumentsValue::expectArgs
                (&local_188,(string *)local_228,(pair<unsigned_long,_unsigned_long> *)local_158,
                 (pair<unsigned_long,_unsigned_long> *)local_248);
      if ((Value *)local_228._0_8_ != pVVar14) {
        operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
      }
      local_68.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Value::array(__return_storage_ptr__,&local_68);
      std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_68);
      Value::keys((vector<minja::Value,_std::allocator<minja::Value>_> *)local_248,&local_e0);
      local_90 = (Value *)local_248._8_8_;
      if (local_248._0_8_ != local_248._8_8_) {
        pVVar14 = (Value *)local_248._0_8_;
        do {
          Value::Value((Value *)local_228,pVVar14);
          pVVar15 = Value::at(&local_e0,pVVar14);
          Value::Value(&local_1d8,pVVar15);
          __l._M_len = 2;
          __l._M_array = (Value *)local_228;
          std::vector<minja::Value,_std::allocator<minja::Value>_>::vector
                    (&local_48,__l,(allocator_type *)local_108);
          Value::array((Value *)local_158,&local_48);
          Value::push_back(__return_storage_ptr__,(Value *)local_158);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_118,false);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_118);
          if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
          }
          if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._24_8_);
          }
          if ((string *)local_158._8_8_ != (string *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = (_Atomic_word *)(local_158._8_8_ + 0xc);
              iVar11 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar11 = *(_Atomic_word *)(local_158._8_8_ + 0xc);
              *(int *)(local_158._8_8_ + 0xc) = iVar11 + -1;
            }
            if (iVar11 == 1) {
              (**(code **)(((_Alloc_hider *)local_158._8_8_)->_M_p + 0x18))();
            }
          }
          std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_48);
          lVar21 = -0xa0;
          this_01 = &local_1d8.primitive_.m_data;
          do {
            nlohmann::json_abi_v3_11_3::
            basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)this_01,false);
            nlohmann::json_abi_v3_11_3::
            basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(this_01);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01[-1].m_value.object !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01[-1].m_value.object)
              ;
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01[-2].m_value.object !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01[-2].m_value.object)
              ;
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01[-3].m_value.object !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01[-3].m_value.object)
              ;
            }
            poVar5 = this_01[-4].m_value.object;
            if (poVar5 != (object_t *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                piVar2 = (int *)((long)&(poVar5->
                                        super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                        ).
                                        super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 4);
                iVar11 = *piVar2;
                *piVar2 = *piVar2 + -1;
                UNLOCK();
              }
              else {
                iVar11 = *(int *)((long)&(poVar5->
                                         super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                         ).
                                         super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + 4);
                *(int *)((long)&(poVar5->
                                super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                ).
                                super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar11 + -1;
              }
              if (iVar11 == 1) {
                (**(code **)((long)&(((poVar5->
                                      super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                      ).
                                      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->first).field_2 + 8
                            ))();
              }
            }
            this_01 = this_01 + -5;
            lVar21 = lVar21 + 0x50;
          } while (lVar21 != 0);
          pVVar14 = pVVar14 + 1;
          __return_storage_ptr__ = local_e8;
        } while (pVVar14 != local_90);
      }
      std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector
                ((vector<minja::Value,_std::allocator<minja::Value>_> *)local_248);
      goto LAB_001ea1a2;
    }
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    local_228._0_8_ = pVVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_228,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    iVar11 = std::__cxx11::string::compare(local_228);
    if ((Value *)local_228._0_8_ != pVVar14) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if (iVar11 == 0) {
      local_228._0_8_ = pVVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"pop method","");
      local_158._0_8_ = (element_type *)0x1;
      local_158._8_8_ = (string *)0x1;
      local_248._0_8_ = (Value *)0x0;
      local_248._8_8_ = (Value *)0x0;
      ArgumentsValue::expectArgs
                (&local_188,(string *)local_228,(pair<unsigned_long,_unsigned_long> *)local_158,
                 (pair<unsigned_long,_unsigned_long> *)local_248);
      if ((Value *)local_228._0_8_ != pVVar14) {
        operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
      }
      Value::pop(__return_storage_ptr__,&local_e0,
                 local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      goto LAB_001ea1a2;
    }
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    local_228._0_8_ = pVVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_228,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    iVar11 = std::__cxx11::string::compare(local_228);
    if ((Value *)local_228._0_8_ != pVVar14) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if (iVar11 == 0) {
      local_228._0_8_ = pVVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"get method","");
      local_158._0_8_ = (element_type *)0x1;
      local_158._8_8_ = (string *)0x2;
      local_248._0_8_ = (Value *)0x0;
      local_248._8_8_ = (Value *)0x0;
      ArgumentsValue::expectArgs
                (&local_188,(string *)local_228,(pair<unsigned_long,_unsigned_long> *)local_158,
                 (pair<unsigned_long,_unsigned_long> *)local_248);
      if ((Value *)local_228._0_8_ != pVVar14) {
        operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
      }
      Value::Value((Value *)local_228,
                   local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      if ((long)local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x50) {
        bVar8 = Value::contains(&local_e0,(Value *)local_228);
        if (!bVar8) {
          Value::Value(__return_storage_ptr__);
          goto LAB_001eae5b;
        }
LAB_001eabf5:
        pVVar14 = Value::at(&local_e0,(Value *)local_228);
      }
      else {
        bVar8 = Value::contains(&local_e0,(Value *)local_228);
        if (bVar8) goto LAB_001eabf5;
        pVVar14 = local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1;
      }
      Value::Value(__return_storage_ptr__,pVVar14);
    }
    else {
      peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pcVar4 = (peVar3->name)._M_dataplus._M_p;
      local_228._0_8_ = pVVar14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_228,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
      bVar8 = Value::contains(&local_e0,(string *)local_228);
      if ((Value *)local_228._0_8_ != pVVar14) {
        operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
      }
      if (!bVar8) goto LAB_001eb2d0;
      peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pcVar4 = (peVar3->name)._M_dataplus._M_p;
      local_248._0_8_ = (Value *)(local_248 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_248,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
      Value::Value((Value *)local_158,(string *)local_248);
      pVVar14 = Value::at(&local_e0,(Value *)local_158);
      Value::Value((Value *)local_228,pVVar14);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_118,false);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_118);
      if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
      }
      if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._24_8_);
      }
      if ((string *)local_158._8_8_ != (string *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(local_158._8_8_ + 0xc);
          iVar11 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar11 = *(_Atomic_word *)(local_158._8_8_ + 0xc);
          *(int *)(local_158._8_8_ + 0xc) = iVar11 + -1;
        }
        if (iVar11 == 1) {
          (**(code **)(((_Alloc_hider *)local_158._8_8_)->_M_p + 0x18))();
        }
      }
      if ((Value *)local_248._0_8_ != (Value *)(local_248 + 0x10)) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
      if (local_1f8 == (element_type *)0x0) {
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_108._0_8_ = local_108 + 0x10;
        pcVar4 = (peVar3->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_108,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_248,"Property \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108);
        plVar17 = (long *)std::__cxx11::string::append(local_248);
        local_158._0_8_ = *plVar17;
        peVar19 = (element_type *)(plVar17 + 2);
        if ((element_type *)local_158._0_8_ == peVar19) {
          local_158._16_8_ =
               (peVar19->super_enable_shared_from_this<minja::Value>)._M_weak_this.
               super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_158._24_8_ = plVar17[3];
          local_158._0_8_ = (element_type *)(local_158 + 0x10);
        }
        else {
          local_158._16_8_ =
               (peVar19->super_enable_shared_from_this<minja::Value>)._M_weak_this.
               super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        local_158._8_8_ = plVar17[1];
        *plVar17 = (long)peVar19;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::runtime_error::runtime_error(prVar16,(string *)local_158);
        __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      Value::call(__return_storage_ptr__,(Value *)local_228,context,&local_188);
    }
LAB_001eae5b:
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_1e8,false);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_1e8);
    if (_Stack_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1f0._M_pi);
    }
    if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._24_8_);
    }
    if ((string *)local_228._8_8_ != (string *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)(local_228._8_8_ + 0xc);
        iVar11 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar11 = *(_Atomic_word *)(local_228._8_8_ + 0xc);
        *(int *)(local_228._8_8_ + 0xc) = iVar11 + -1;
      }
      if (iVar11 == 1) {
        (**(code **)(((_Alloc_hider *)local_228._8_8_)->_M_p + 0x18))();
      }
    }
    goto LAB_001ea1a2;
  }
  if (local_e0.primitive_.m_data.m_type != string) {
LAB_001eb2d0:
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_158._0_8_ = local_158 + 0x10;
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_158,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                   "Unknown method: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    std::runtime_error::runtime_error(prVar16,(string *)local_228);
    __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Value::get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
             &local_e0);
  peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  pVVar14 = (Value *)(local_228 + 0x10);
  pcVar4 = (peVar3->name)._M_dataplus._M_p;
  local_228._0_8_ = pVVar14;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
  iVar11 = std::__cxx11::string::compare(local_228);
  if ((Value *)local_228._0_8_ != pVVar14) {
    operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
  }
  if (iVar11 == 0) {
    local_228._0_8_ = pVVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"strip method","");
    local_248._0_8_ = (Value *)0x0;
    local_248._8_8_ = (Value *)0x1;
    local_108._0_8_ = (string *)0x0;
    local_108._8_8_ = (string *)0x0;
    ArgumentsValue::expectArgs
              (&local_188,(string *)local_228,(pair<unsigned_long,_unsigned_long> *)local_248,
               (pair<unsigned_long,_unsigned_long> *)local_108);
    if ((Value *)local_228._0_8_ != pVVar14) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if (local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_228._0_8_ = pVVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"");
    }
    else {
      Value::get<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                 local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    }
    strip((string *)local_248,(minja *)local_158,(string *)local_228._0_8_,(string *)local_228._8_8_
          ,true,true);
    Value::Value(__return_storage_ptr__,(string *)local_248);
LAB_001eafa7:
    if ((Value *)local_248._0_8_ != (Value *)(local_248 + 0x10)) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
LAB_001eafc2:
    local_248._16_8_ = local_228._16_8_;
    pVVar15 = (Value *)local_228._0_8_;
    if ((Value *)local_228._0_8_ != pVVar14) {
LAB_001eafd1:
      operator_delete(pVVar15,local_248._16_8_ + 1);
    }
  }
  else {
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    local_228._0_8_ = pVVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_228,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    iVar11 = std::__cxx11::string::compare(local_228);
    if ((Value *)local_228._0_8_ != pVVar14) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if (iVar11 == 0) {
      local_228._0_8_ = pVVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"lstrip method","");
      local_248._0_8_ = (Value *)0x0;
      local_248._8_8_ = (Value *)0x1;
      local_108._0_8_ = (string *)0x0;
      local_108._8_8_ = (string *)0x0;
      ArgumentsValue::expectArgs
                (&local_188,(string *)local_228,(pair<unsigned_long,_unsigned_long> *)local_248,
                 (pair<unsigned_long,_unsigned_long> *)local_108);
      if ((Value *)local_228._0_8_ != pVVar14) {
        operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
      }
      if (local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_228._0_8_ = pVVar14;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"");
      }
      else {
        Value::get<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                   local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      }
      strip((string *)local_248,(minja *)local_158,(string *)local_228._0_8_,
            (string *)local_228._8_8_,true,false);
      Value::Value(__return_storage_ptr__,(string *)local_248);
      goto LAB_001eafa7;
    }
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    local_228._0_8_ = pVVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_228,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    iVar11 = std::__cxx11::string::compare(local_228);
    if ((Value *)local_228._0_8_ != pVVar14) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if (iVar11 == 0) {
      local_228._0_8_ = pVVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"rstrip method","");
      local_248._0_8_ = (Value *)0x0;
      local_248._8_8_ = (Value *)0x1;
      local_108._0_8_ = (string *)0x0;
      local_108._8_8_ = (string *)0x0;
      ArgumentsValue::expectArgs
                (&local_188,(string *)local_228,(pair<unsigned_long,_unsigned_long> *)local_248,
                 (pair<unsigned_long,_unsigned_long> *)local_108);
      if ((Value *)local_228._0_8_ != pVVar14) {
        operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
      }
      if (local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_228._0_8_ = pVVar14;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"");
      }
      else {
        Value::get<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                   local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      }
      strip((string *)local_248,(minja *)local_158,(string *)local_228._0_8_,
            (string *)local_228._8_8_,false,true);
      Value::Value(__return_storage_ptr__,(string *)local_248);
      goto LAB_001eafa7;
    }
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    local_228._0_8_ = pVVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_228,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    iVar11 = std::__cxx11::string::compare(local_228);
    if ((Value *)local_228._0_8_ != pVVar14) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if (iVar11 != 0) {
      peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pcVar4 = (peVar3->name)._M_dataplus._M_p;
      local_228._0_8_ = pVVar14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_228,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
      iVar11 = std::__cxx11::string::compare(local_228);
      if ((Value *)local_228._0_8_ != pVVar14) {
        operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
      }
      if (iVar11 == 0) {
        local_228._0_8_ = pVVar14;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"capitalize method","");
        local_248._0_8_ = (Value *)0x0;
        local_248._8_8_ = (Value *)0x0;
        local_108._0_8_ = (string *)0x0;
        local_108._8_8_ = (string *)0x0;
        ArgumentsValue::expectArgs
                  (&local_188,(string *)local_228,(pair<unsigned_long,_unsigned_long> *)local_248,
                   (pair<unsigned_long,_unsigned_long> *)local_108);
        if ((Value *)local_228._0_8_ != pVVar14) {
          operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
        }
        capitalize((string *)local_228,(minja *)local_158._0_8_,(string *)local_158._8_8_);
        Value::Value(__return_storage_ptr__,(string *)local_228);
      }
      else {
        peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pcVar4 = (peVar3->name)._M_dataplus._M_p;
        local_228._0_8_ = pVVar14;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_228,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
        iVar11 = std::__cxx11::string::compare(local_228);
        if ((Value *)local_228._0_8_ != pVVar14) {
          operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
        }
        if (iVar11 == 0) {
          local_228._0_8_ = pVVar14;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"endswith method","");
          local_248._0_8_ = (pointer)0x1;
          local_248._8_8_ = (Value *)0x1;
          local_108._0_8_ = (string *)0x0;
          local_108._8_8_ = (string *)0x0;
          ArgumentsValue::expectArgs
                    (&local_188,(string *)local_228,(pair<unsigned_long,_unsigned_long> *)local_248,
                     (pair<unsigned_long,_unsigned_long> *)local_108);
          if ((Value *)local_228._0_8_ != pVVar14) {
            operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
          }
          Value::get<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                     local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                     _M_impl.super__Vector_impl_data._M_start);
          if ((ulong)local_158._8_8_ < (ulong)local_228._8_8_) {
LAB_001eb088:
            uVar10 = 0;
          }
          else {
            uVar10 = 1;
            if ((string *)local_228._8_8_ != (string *)0x0) {
              lVar21 = 0;
              do {
                if (*(minja *)((char *)(local_228._0_8_ + local_228._8_8_) + lVar21 + -1) !=
                    ((minja *)((long)&((_Alloc_hider *)local_158._8_8_)->_M_p + local_158._0_8_))
                    [lVar21 + -1]) goto LAB_001eb088;
                lVar21 = lVar21 + -1;
              } while ((string *)-lVar21 != (string *)local_228._8_8_);
            }
          }
          local_248[0] = uVar10;
          Value::Value(__return_storage_ptr__,(bool *)local_248);
        }
        else {
          peVar3 = (this->method).
                   super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pcVar4 = (peVar3->name)._M_dataplus._M_p;
          local_228._0_8_ = pVVar14;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_228,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
          iVar11 = std::__cxx11::string::compare(local_228);
          if ((Value *)local_228._0_8_ != pVVar14) {
            operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
          }
          if (iVar11 != 0) {
            if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
              operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
            }
            goto LAB_001eb2d0;
          }
          local_228._0_8_ = pVVar14;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"title method","");
          local_248._0_8_ = (Value *)0x0;
          local_248._8_8_ = (Value *)0x0;
          local_108._0_8_ = (string *)0x0;
          local_108._8_8_ = (string *)0x0;
          ArgumentsValue::expectArgs
                    (&local_188,(string *)local_228,(pair<unsigned_long,_unsigned_long> *)local_248,
                     (pair<unsigned_long,_unsigned_long> *)local_108);
          if ((Value *)local_228._0_8_ != pVVar14) {
            operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
          }
          local_228._0_8_ = pVVar14;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_228,local_158._0_8_,
                     (minja *)((long)&((_Alloc_hider *)local_158._8_8_)->_M_p + local_158._0_8_));
          uVar7 = local_228._8_8_;
          if ((string *)local_228._8_8_ != (string *)0x0) {
            psVar20 = (string *)0x0;
            do {
              uVar6 = local_228._0_8_;
              if (psVar20 == (string *)0x0) {
                iVar11 = (int)*(char *)local_228._0_8_;
LAB_001ea5dd:
                iVar11 = toupper(iVar11);
                cVar9 = (char)iVar11;
              }
              else {
                iVar12 = isspace((int)((char *)(local_228._0_8_ + -1))[(long)psVar20]);
                iVar11 = (int)*(char *)(uVar6 + (long)psVar20);
                if (iVar12 != 0) goto LAB_001ea5dd;
                iVar11 = tolower(iVar11);
                cVar9 = (char)iVar11;
              }
              *(char *)(uVar6 + (long)psVar20) = cVar9;
              psVar20 = (string *)((long)&(psVar20->_M_dataplus)._M_p + 1);
            } while ((string *)uVar7 != psVar20);
          }
          Value::Value(__return_storage_ptr__,(string *)local_228);
        }
      }
      goto LAB_001eafc2;
    }
    local_228._0_8_ = pVVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"split method","");
    local_248._0_8_ = (Value *)0x1;
    local_248._8_8_ = (Value *)0x1;
    local_108._0_8_ = (string *)0x0;
    local_108._8_8_ = (string *)0x0;
    ArgumentsValue::expectArgs
              (&local_188,(string *)local_228,(pair<unsigned_long,_unsigned_long> *)local_248,
               (pair<unsigned_long,_unsigned_long> *)local_108);
    if ((Value *)local_228._0_8_ != pVVar14) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    Value::get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
               local_188.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
               _M_impl.super__Vector_impl_data._M_start);
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_108,(string *)local_158,(string *)local_248);
    local_88.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Value::array(__return_storage_ptr__,&local_88);
    std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_88);
    uVar7 = local_108._8_8_;
    if (local_108._0_8_ != local_108._8_8_) {
      psVar20 = (string *)local_108._0_8_;
      do {
        Value::Value((Value *)local_228,psVar20);
        Value::push_back(__return_storage_ptr__,(Value *)local_228);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_1e8,false);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_1e8);
        if (_Stack_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1f0._M_pi);
        }
        if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._24_8_);
        }
        if ((string *)local_228._8_8_ != (string *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = (_Atomic_word *)(local_228._8_8_ + 0xc);
            iVar11 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar11 = *(_Atomic_word *)(local_228._8_8_ + 0xc);
            *(int *)(local_228._8_8_ + 0xc) = iVar11 + -1;
          }
          if (iVar11 == 1) {
            (**(code **)(((_Alloc_hider *)local_228._8_8_)->_M_p + 0x18))();
          }
        }
        psVar20 = psVar20 + 1;
      } while (psVar20 != (string *)uVar7);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
    pVVar15 = (Value *)local_248._0_8_;
    if ((Value *)local_248._0_8_ != (Value *)(local_248 + 0x10)) goto LAB_001eafd1;
  }
  if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
  }
LAB_001ea1a2:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
  ::~vector(&local_188.kwargs);
  std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_188.args);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_e0.primitive_.m_data,false);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_e0.primitive_.m_data);
  if (local_e0.callable_.
      super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.callable_.
               super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_e0.object_.
      super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.object_.
               super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_e0.array_.
      super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.array_.
               super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_e0.super_enable_shared_from_this<minja::Value>._M_weak_this.
      super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_e0.super_enable_shared_from_this<minja::Value>._M_weak_this.
                 super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      iVar11 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar11 = (local_e0.super_enable_shared_from_this<minja::Value>._M_weak_this.
                super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_weak_count;
      (local_e0.super_enable_shared_from_this<minja::Value>._M_weak_this.
       super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = iVar11 + -1;
    }
    if (iVar11 == 1) {
      (*(local_e0.super_enable_shared_from_this<minja::Value>._M_weak_this.
         super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[3])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!object) throw std::runtime_error("MethodCallExpr.object is null");
        if (!method) throw std::runtime_error("MethodCallExpr.method is null");
        auto obj = object->evaluate(context);
        auto vargs = args.evaluate(context);
        if (obj.is_null()) {
          throw std::runtime_error("Trying to call method '" + method->get_name() + "' on null");
        }
        if (obj.is_array()) {
          if (method->get_name() == "append") {
              vargs.expectArgs("append method", {1, 1}, {0, 0});
              obj.push_back(vargs.args[0]);
              return Value();
          } else if (method->get_name() == "pop") {
              vargs.expectArgs("pop method", {0, 1}, {0, 0});
              return obj.pop(vargs.args.empty() ? Value() : vargs.args[0]);
          } else if (method->get_name() == "insert") {
              vargs.expectArgs("insert method", {2, 2}, {0, 0});
              auto index = vargs.args[0].get<int64_t>();
              if (index < 0 || index > (int64_t) obj.size()) throw std::runtime_error("Index out of range for insert method");
              obj.insert(index, vargs.args[1]);
              return Value();
          }
        } else if (obj.is_object()) {
          if (method->get_name() == "items") {
            vargs.expectArgs("items method", {0, 0}, {0, 0});
            auto result = Value::array();
            for (const auto& key : obj.keys()) {
              result.push_back(Value::array({key, obj.at(key)}));
            }
            return result;
          } else if (method->get_name() == "pop") {
            vargs.expectArgs("pop method", {1, 1}, {0, 0});
            return obj.pop(vargs.args[0]);
          } else if (method->get_name() == "get") {
            vargs.expectArgs("get method", {1, 2}, {0, 0});
            auto key = vargs.args[0];
            if (vargs.args.size() == 1) {
              return obj.contains(key) ? obj.at(key) : Value();
            } else {
              return obj.contains(key) ? obj.at(key) : vargs.args[1];
            }
          } else if (obj.contains(method->get_name())) {
            auto callable = obj.at(method->get_name());
            if (!callable.is_callable()) {
              throw std::runtime_error("Property '" + method->get_name() + "' is not callable");
            }
            return callable.call(context, vargs);
          }
        } else if (obj.is_string()) {
          auto str = obj.get<std::string>();
          if (method->get_name() == "strip") {
            vargs.expectArgs("strip method", {0, 1}, {0, 0});
            auto chars = vargs.args.empty() ? "" : vargs.args[0].get<std::string>();
            return Value(strip(str, chars));
          } else if (method->get_name() == "lstrip") {
            vargs.expectArgs("lstrip method", {0, 1}, {0, 0});
            auto chars = vargs.args.empty() ? "" : vargs.args[0].get<std::string>();
            return Value(strip(str, chars, /* left= */ true, /* right= */ false));
          } else if (method->get_name() == "rstrip") {
            vargs.expectArgs("rstrip method", {0, 1}, {0, 0});
            auto chars = vargs.args.empty() ? "" : vargs.args[0].get<std::string>();
            return Value(strip(str, chars, /* left= */ false, /* right= */ true));
          } else if (method->get_name() == "split") {
            vargs.expectArgs("split method", {1, 1}, {0, 0});
            auto sep = vargs.args[0].get<std::string>();
            auto parts = split(str, sep);
            Value result = Value::array();
            for (const auto& part : parts) {
              result.push_back(Value(part));
            }
            return result;
          } else if (method->get_name() == "capitalize") {
            vargs.expectArgs("capitalize method", {0, 0}, {0, 0});
            return Value(capitalize(str));
          } else if (method->get_name() == "endswith") {
            vargs.expectArgs("endswith method", {1, 1}, {0, 0});
            auto suffix = vargs.args[0].get<std::string>();
            return suffix.length() <= str.length() && std::equal(suffix.rbegin(), suffix.rend(), str.rbegin());
          } else if (method->get_name() == "title") {
            vargs.expectArgs("title method", {0, 0}, {0, 0});
            auto res = str;
            for (size_t i = 0, n = res.size(); i < n; ++i) {
              if (i == 0 || std::isspace(res[i - 1])) res[i] = std::toupper(res[i]);
              else res[i] = std::tolower(res[i]);
            }
            return res;
          }
        }
        throw std::runtime_error("Unknown method: " + method->get_name());
    }